

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O2

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,TableNameField *field,void *data)

{
  int table_register;
  Function *this_00;
  uint uVar1;
  uint key_register;
  
  table_register = *data;
  this_00 = this->current_function_->function_;
  uVar1 = Function::AddConstString(this_00,(field->name_).field_0.str_);
  key_register = GenerateRegisterId(this);
  Function::AddInstruction
            (this_00,(Instruction)((uVar1 & 0xffff) + (key_register & 0xff) * 0x10000 + 0x5000000),
             (field->name_).line_);
  SetTableFieldValue<luna::TableNameField>
            (this,field,table_register,key_register,(field->name_).line_);
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(TableNameField *field, void *data)
    {
        auto field_data = static_cast<TableFieldData *>(data);
        auto table_register = field_data->table_register_;

        // Load key
        auto function = GetCurrentFunction();
        auto key_index = function->AddConstString(field->name_.str_);
        auto key_register = GenerateRegisterId();
        auto instruction = Instruction::ABxCode(OpType_LoadConst, key_register, key_index);
        function->AddInstruction(instruction, field->name_.line_);

        SetTableFieldValue(field, table_register, key_register, field->name_.line_);
    }